

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_sct_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  pointer psVar4;
  pointer pcVar5;
  uint8_t *data;
  size_t len;
  bool local_59;
  undefined1 local_58 [8];
  CBB contents;
  SSL *ssl;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  contents.u._24_8_ = hs->ssl;
  if ((*(uint *)&hs->field_0x6c8 >> 2 & 1) == 0) {
    __assert_fail("hs->scts_requested",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x527,"bool bssl::ext_sct_add_serverhello(SSL_HANDSHAKE *, CBB *)");
  }
  uVar2 = ssl_protocol_version((SSL *)contents.u._24_8_);
  if (((uVar2 < 0x304) && ((*(ushort *)(*(long *)(contents.u._24_8_ + 0x30) + 0xdc) >> 5 & 1) == 0))
     && (bVar1 = ssl_cipher_uses_certificate_auth(hs->new_cipher), bVar1)) {
    psVar4 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                       (&hs->credential);
    bVar1 = std::operator==(&psVar4->signed_cert_timestamp_list,(nullptr_t)0x0);
    if (!bVar1) {
      iVar3 = CBB_add_u16(out,0x12);
      local_59 = false;
      if (iVar3 != 0) {
        iVar3 = CBB_add_u16_length_prefixed(out,(CBB *)local_58);
        local_59 = false;
        if (iVar3 != 0) {
          psVar4 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                             (&hs->credential);
          pcVar5 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                             (&psVar4->signed_cert_timestamp_list);
          data = CRYPTO_BUFFER_data(pcVar5);
          psVar4 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                             (&hs->credential);
          pcVar5 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                             (&psVar4->signed_cert_timestamp_list);
          len = CRYPTO_BUFFER_len(pcVar5);
          iVar3 = CBB_add_bytes((CBB *)local_58,data,len);
          local_59 = false;
          if (iVar3 != 0) {
            iVar3 = CBB_flush(out);
            local_59 = iVar3 != 0;
          }
        }
      }
      return local_59;
    }
  }
  return true;
}

Assistant:

static bool ext_sct_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  assert(hs->scts_requested);
  // The extension shouldn't be sent when resuming sessions.
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION || ssl->s3->session_reused ||
      !ssl_cipher_uses_certificate_auth(hs->new_cipher) ||
      hs->credential->signed_cert_timestamp_list == nullptr) {
    return true;
  }

  CBB contents;
  return CBB_add_u16(out, TLSEXT_TYPE_certificate_timestamp) &&
         CBB_add_u16_length_prefixed(out, &contents) &&
         CBB_add_bytes(&contents,
                       CRYPTO_BUFFER_data(
                           hs->credential->signed_cert_timestamp_list.get()),
                       CRYPTO_BUFFER_len(
                           hs->credential->signed_cert_timestamp_list.get())) &&
         CBB_flush(out);
}